

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                         *v)

{
  pointer pWVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long lVar6;
  
  if ((v->
      super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (v->
      super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = "[]";
    lVar6 = 2;
  }
  else {
    uVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    pWVar1 = (v->
             super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>(os,"{\"word\": \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pWVar1->word)._M_dataplus._M_p,(pWVar1->word)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", \"offset\": ",0xd);
    poVar2 = operator<<(poVar2,&pWVar1->offsets);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", \"weight\": ",0xc);
    poVar2 = std::ostream::_M_insert<double>(pWVar1->weight);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
    if (0x40 < (ulong)((long)(v->
                             super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(v->
                            super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      lVar6 = 0x40;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        pWVar1 = (v->
                 super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>(os,"{\"word\": \"",10);
        puVar5 = (undefined8 *)((long)&(pWVar1->word)._M_dataplus._M_p + lVar6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)*puVar5,puVar5[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", \"offset\": ",0xd);
        poVar2 = operator<<(poVar2,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (puVar5 + 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", \"weight\": ",0xc);
        poVar2 = std::ostream::_M_insert<double>((double)puVar5[7]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x40;
      } while (uVar3 < (ulong)((long)(v->
                                     super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(v->
                                     super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    pcVar4 = "]";
    lVar6 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar6);
  return os;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}